

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q2.cpp
# Opt level: O2

BSTree<const_int_&,_int>
bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
          (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *end,
          int *default_value)

{
  BSTree<const_int_&,_int> bst;
  Function inserter;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  Function local_50;
  anon_class_24_3_04ddf3ad local_30;
  
  local_30.bst = (BSTree<const_int_&,_int> *)&local_58;
  local_58._M_current = (int *)0x0;
  local_30.inserter = &local_50;
  std::
  function<void(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&)>
  ::
  function<bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,int_const&)::_lambda(auto:1_const&,auto:2_const&)_1_,void>
            ((function<void(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&)>
              *)local_30.inserter,&local_30);
  std::
  function<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&)>
  ::operator()(&local_50,end,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               default_value);
  begin->_M_current = (int *)local_58;
  local_58._M_current = (int *)0x0;
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::
  unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  ::~unique_ptr((unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                 *)&local_58);
  return (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)
         (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)begin;
}

Assistant:

auto bstree_from_sorted(const Iterator& begin, const Iterator& end, const Val& default_value){
  // we are going to use Key as the type of elements within range
  // [begin, end)
  using Key      = decltype(*begin);
  // we are going to use a recursive function to perform the insertions
  using Function = std::function<void(const Iterator&, const Iterator&)>;

  // an empty BSTree
  BSTree<Key, Val> bst {};

  Function inserter {[&bst, &default_value, &inserter](const auto& begin, const auto& end) {
                       // if range is not empty
                       if (begin < end){
                         // we calculate half of the range length
                         auto length      {std::distance(begin, end)};
                         auto half_length {length / 2};

                         // we insert the middle element (odd length)
                         // or the first element of second half (even
                         // length)
                         bst.insert(*(begin + half_length), default_value);

                         // we recurse into each half, excluding the
                         // element that was just inserted
                         inserter(begin, begin + half_length);
                         inserter(begin + half_length + 1, end);
                       }
                     }};

  // we begin the insertion process to the whole range
  inserter(begin, end);

  // at the end, we return the BSTree
  return bst;
}